

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression.c
# Opt level: O0

int WebRtcNs_InitCore(NoiseSuppressionC *self,uint32_t fs)

{
  float in_ESI;
  NoiseSuppressionC *in_RDI;
  float fVar1;
  float *unaff_retaddr;
  int in_stack_0000000c;
  int i;
  float local_1c;
  int local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDI == (NoiseSuppressionC *)0x0) {
    iVar2 = -1;
  }
  else if ((in_ESI == 1.12104e-41) || (in_ESI == 2.24208e-41)) {
    in_RDI->fs = (uint32_t)in_ESI;
    in_RDI->windShift = 0;
    if (in_ESI == 1.12104e-41) {
      in_RDI->blockLen = 0x50;
      in_RDI->anaLen = 0x80;
      in_RDI->window = kBlocks80w128;
    }
    else {
      in_RDI->blockLen = 0xa0;
      in_RDI->anaLen = 0x100;
      in_RDI->window = kBlocks160w256;
    }
    in_RDI->magnLen = (in_RDI->anaLen >> 1) + 1;
    local_1c = (float)in_RDI->magnLen;
    in_RDI->normMagnLen = 1.0 / local_1c;
    in_RDI->ip[0] = 0;
    memset(in_RDI->dataBuf,0,0x400);
    WebRtc_rdft(CONCAT44(fs,i),in_stack_0000000c,unaff_retaddr,
                (size_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                (float *)in_RDI);
    memset(in_RDI->analyzeBuf,0,0x400);
    memset(in_RDI->dataBuf,0,0x400);
    memset(in_RDI->syntBuf,0,0x400);
    memset(in_RDI->dataBufHB,0,0x800);
    memset(in_RDI->quantile,0,0x204);
    for (local_18 = 0; local_18 < 0x183; local_18 = local_18 + 1) {
      in_RDI->lquantile[local_18] = 8.0;
      in_RDI->density[local_18] = 0.3;
    }
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      fVar1 = floorf((float)((local_18 + 1) * 200) / 3.0);
      in_RDI->counter[local_18] = (int)fVar1;
    }
    in_RDI->updates = 0;
    for (local_18 = 0; local_18 < 0x81; local_18 = local_18 + 1) {
      in_RDI->smooth[local_18] = 1.0;
      fVar1 = logf((float)local_18);
      in_RDI->log_lut[local_18] = fVar1;
      in_RDI->log_lut_sqr[local_18] = in_RDI->log_lut[local_18] * in_RDI->log_lut[local_18];
    }
    in_RDI->aggrMode = 0;
    in_RDI->priorSpeechProb = 0.5;
    memset(in_RDI->magnPrevAnalyze,0,0x204);
    memset(in_RDI->magnPrevProcess,0,0x204);
    memset(in_RDI->noise,0,0x204);
    memset(in_RDI->noisePrev,0,0x204);
    memset(in_RDI->magnAvgPause,0,0x204);
    memset(in_RDI->speechProb,0,0x204);
    memset(in_RDI->initMagnEst,0,0x204);
    for (local_18 = 0; local_18 < 0x81; local_18 = local_18 + 1) {
      in_RDI->logLrtTimeAvg[local_18] = 0.5;
    }
    in_RDI->featureData[0] = 0.5;
    in_RDI->featureData[1] = 0.0;
    in_RDI->featureData[2] = 0.0;
    in_RDI->featureData[3] = 0.5;
    in_RDI->featureData[4] = 0.5;
    in_RDI->featureData[5] = 0.0;
    in_RDI->featureData[6] = 0.0;
    memset(in_RDI->histLrt,0,4000);
    memset(in_RDI->histSpecFlat,0,4000);
    memset(in_RDI->histSpecDiff,0,4000);
    in_RDI->blockInd = -1;
    in_RDI->priorModelPars[0] = 0.5;
    in_RDI->priorModelPars[1] = 0.5;
    in_RDI->priorModelPars[2] = 1.0;
    in_RDI->priorModelPars[3] = 0.5;
    in_RDI->priorModelPars[4] = 1.0;
    in_RDI->priorModelPars[5] = 0.0;
    in_RDI->priorModelPars[6] = 0.0;
    in_RDI->modelUpdatePars[0] = 2;
    in_RDI->modelUpdatePars[1] = 500;
    in_RDI->modelUpdatePars[2] = 0;
    in_RDI->modelUpdatePars[3] = in_RDI->modelUpdatePars[1];
    in_RDI->signalEnergy = 0.0;
    in_RDI->sumMagn = 0.0;
    in_RDI->whiteNoiseLevel = 0.0;
    in_RDI->pinkNoiseNumerator = 0.0;
    in_RDI->pinkNoiseExp = 0.0;
    set_feature_extraction_parameters(in_RDI);
    WebRtcNs_set_policy_core(in_RDI,0);
    in_RDI->initFlag = 1;
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int WebRtcNs_InitCore(NoiseSuppressionC *self, uint32_t fs) {
    int i;
    // Check for valid pointer.
    if (self == NULL) {
        return -1;
    }
    // Initialization of struct.
    if (fs == 8000 || fs == 16000) {
        self->fs = fs;
    } else {
        return -1;
    }
    self->windShift = 0;
    // We only support 10ms frames.
    if (fs == 8000) {
        self->blockLen = 80;
        self->anaLen = 128;
        self->window = kBlocks80w128;
    } else {
        self->blockLen = 160;
        self->anaLen = 256;
        self->window = kBlocks160w256;
    }
    self->magnLen = self->anaLen / 2 + 1;  // Number of frequency bins.
    self->normMagnLen = 1.0f / self->magnLen;
    // Initialize FFT work arrays.
    self->ip[0] = 0;  // Setting this triggers initialization.
    memset(self->dataBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);
    WebRtc_rdft(self->anaLen, 1, self->dataBuf, self->ip, self->wfft);

    memset(self->analyzeBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);
    memset(self->dataBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);
    memset(self->syntBuf, 0, sizeof(float) * ANAL_BLOCKL_MAX);

    // For HB processing.
    memset(self->dataBufHB,
           0,
           sizeof(float) * NUM_HIGH_BANDS_MAX * ANAL_BLOCKL_MAX);

    // For quantile noise estimation.
    memset(self->quantile, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    for (i = 0; i < SIMULT * HALF_ANAL_BLOCKL; i++) {
        self->lquantile[i] = 8.f;
        self->density[i] = 0.3f;
    }

    for (i = 0; i < SIMULT; i++) {
        self->counter[i] =
                (int) floorf((float) (END_STARTUP_LONG * (i + 1)) / (float) SIMULT);
    }

    self->updates = 0;

    // Wiener filter initialization.
    for (i = 0; i < HALF_ANAL_BLOCKL; i++) {
        self->smooth[i] = 1.f;
        self->log_lut[i] = logf((float) i);
        self->log_lut_sqr[i] = self->log_lut[i] * self->log_lut[i];
    }

    // Set the aggressiveness: default.
    self->aggrMode = 0;

    // Initialize variables for new method.
    self->priorSpeechProb = 0.5f;  // Prior prob for speech/noise.
    // Previous analyze mag spectrum.
    memset(self->magnPrevAnalyze, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Previous process mag spectrum.
    memset(self->magnPrevProcess, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Current noise-spectrum.
    memset(self->noise, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Previous noise-spectrum.
    memset(self->noisePrev, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Conservative noise spectrum estimate.
    memset(self->magnAvgPause, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // For estimation of HB in second pass.
    memset(self->speechProb, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    // Initial average magnitude spectrum.
    memset(self->initMagnEst, 0, sizeof(float) * HALF_ANAL_BLOCKL);
    for (i = 0; i < HALF_ANAL_BLOCKL; i++) {
        // Smooth LR (same as threshold).
        self->logLrtTimeAvg[i] = LRT_FEATURE_THR;
    }

    // Feature quantities.
    // Spectral flatness (start on threshold).
    self->featureData[0] = SF_FEATURE_THR;
    self->featureData[1] = 0.f;  // Spectral entropy: not used in this version.
    self->featureData[2] = 0.f;  // Spectral variance: not used in this version.
    // Average LRT factor (start on threshold).
    self->featureData[3] = LRT_FEATURE_THR;
    // Spectral template diff (start on threshold).
    self->featureData[4] = SF_FEATURE_THR;
    self->featureData[5] = 0.f;  // Normalization for spectral difference.
    // Window time-average of input magnitude spectrum.
    self->featureData[6] = 0.f;

    // Histogram quantities: used to estimate/update thresholds for features.
    memset(self->histLrt, 0, sizeof(int) * HIST_PAR_EST);
    memset(self->histSpecFlat, 0, sizeof(int) * HIST_PAR_EST);
    memset(self->histSpecDiff, 0, sizeof(int) * HIST_PAR_EST);


    self->blockInd = -1;  // Frame counter.
    // Default threshold for LRT feature.
    self->priorModelPars[0] = LRT_FEATURE_THR;
    // Threshold for spectral flatness: determined on-line.
    self->priorModelPars[1] = 0.5f;
    // sgn_map par for spectral measure: 1 for flatness measure.
    self->priorModelPars[2] = 1.f;
    // Threshold for template-difference feature: determined on-line.
    self->priorModelPars[3] = 0.5f;
    // Default weighting parameter for LRT feature.
    self->priorModelPars[4] = 1.f;
    // Default weighting parameter for spectral flatness feature.
    self->priorModelPars[5] = 0.f;
    // Default weighting parameter for spectral difference feature.
    self->priorModelPars[6] = 0.f;

    // Update flag for parameters:
    // 0 no update, 1 = update once, 2 = update every window.
    self->modelUpdatePars[0] = 2;
    self->modelUpdatePars[1] = 500;  // Window for update.
    // Counter for update of conservative noise spectrum.
    self->modelUpdatePars[2] = 0;
    // Counter if the feature thresholds are updated during the sequence.
    self->modelUpdatePars[3] = self->modelUpdatePars[1];

    self->signalEnergy = 0.0;
    self->sumMagn = 0.0;
    self->whiteNoiseLevel = 0.0;
    self->pinkNoiseNumerator = 0.0;
    self->pinkNoiseExp = 0.0;

    set_feature_extraction_parameters(self);

    // Default mode.
    WebRtcNs_set_policy_core(self, 0);

    self->initFlag = 1;
    return 0;
}